

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O2

void __thiscall polyscope::Widget::Widget(Widget *this)

{
  WeakHandle<polyscope::Widget> local_30;
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x8);
  this->_vptr_Widget = (_func_int **)0x5957f8;
  *(undefined8 *)&this->field_0x8 = 0x595838;
  WeakReferrable::getWeakHandle<polyscope::Widget>
            (&local_30,(WeakReferrable *)&this->field_0x8,this);
  std::
  vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
  ::emplace_back<polyscope::WeakHandle<polyscope::Widget>>
            ((vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
              *)&state::widgets,&local_30);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&local_30.super_GenericWeakHandle.sentinel.
              super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Widget::Widget() { state::widgets.push_back(getWeakHandle<Widget>(this)); }